

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void * merge(void *a,void *b,_func_int_varargs *cmp,size_t offset)

{
  int iVar1;
  char *local_38;
  char *head;
  char *ptr;
  size_t offset_local;
  _func_int_varargs *cmp_local;
  void *b_local;
  void *a_local;
  
  local_38 = (char *)b;
  if ((a != (void *)0x0) && (local_38 = (char *)a, b != (void *)0x0)) {
    iVar1 = (*cmp)(a,b);
    if (iVar1 < 1) {
      b_local = *(void **)((long)a + offset);
      head = (char *)a;
      cmp_local = (_func_int_varargs *)b;
    }
    else {
      cmp_local = *(_func_int_varargs **)((long)b + offset);
      head = (char *)b;
      b_local = a;
    }
    local_38 = head;
    while (b_local != (void *)0x0 && cmp_local != (_func_int_varargs *)0x0) {
      iVar1 = (*cmp)(b_local,cmp_local);
      if (iVar1 < 1) {
        *(void **)(head + offset) = b_local;
        head = (char *)b_local;
        b_local = *(void **)((long)b_local + offset);
      }
      else {
        *(_func_int_varargs **)(head + offset) = cmp_local;
        head = (char *)cmp_local;
        cmp_local = *(_func_int_varargs **)(cmp_local + offset);
      }
    }
    if (b_local == (void *)0x0) {
      *(_func_int_varargs **)(head + offset) = cmp_local;
    }
    else {
      *(void **)(head + offset) = b_local;
    }
  }
  return local_38;
}

Assistant:

static void *merge(void *a,void *b,int (*cmp)(),size_t offset)
{
  char *ptr, *head;

  if( a==0 ){
    head = b;
  }else if( b==0 ){
    head = a;
  }else{
    if( (*cmp)(a,b)<=0 ){
      ptr = a;
      a = NEXT(a);
    }else{
      ptr = b;
      b = NEXT(b);
    }
    head = ptr;
    while( a && b ){
      if( (*cmp)(a,b)<=0 ){
        NEXT(ptr) = a;
        ptr = a;
        a = NEXT(a);
      }else{
        NEXT(ptr) = b;
        ptr = b;
        b = NEXT(b);
      }
    }
    if( a ) NEXT(ptr) = a;
    else    NEXT(ptr) = b;
  }
  return head;
}